

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O0

int rdacc_mixw(char *dir,float32 ****inout_mixw_acc,uint32 *inout_n_mixw,uint32 *inout_n_stream,
              uint32 *inout_n_density)

{
  int iVar1;
  uint local_1064;
  uint local_1060;
  uint32 n_density;
  uint32 n_stream;
  uint32 n_mixw;
  float32 ***mixw_acc;
  float32 ***in_mixw_acc;
  char fn [4097];
  uint32 *inout_n_density_local;
  uint32 *inout_n_stream_local;
  uint32 *inout_n_mixw_local;
  float32 ****inout_mixw_acc_local;
  char *dir_local;
  
  sprintf((char *)&in_mixw_acc,"%s/mixw_counts",dir);
  iVar1 = s3mixw_read((char *)&in_mixw_acc,&mixw_acc,&n_density,&local_1060,&local_1064);
  if (iVar1 != 0) {
    return -1;
  }
  _n_stream = *inout_mixw_acc;
  if (_n_stream == (float32 ***)0x0) {
    *inout_mixw_acc = mixw_acc;
    *inout_n_mixw = n_density;
    *inout_n_stream = local_1060;
    *inout_n_density = local_1064;
  }
  else {
    if (*inout_n_mixw != n_density) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x96,"# mixw in file %s (== %u) != prior # mixw (== %u)\n",&in_mixw_acc,
              (ulong)n_density,*inout_n_mixw);
      return -1;
    }
    if (*inout_n_stream != local_1060) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x9d,"# stream in file %s (== %u) != prior # stream (== %u)\n",&in_mixw_acc,
              (ulong)local_1060,*inout_n_stream);
      return -1;
    }
    if (*inout_n_density != local_1064) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0xa4,"# density comp/mix in file %s (== %u) != prior # density (== %u)\n",
              &in_mixw_acc,(ulong)local_1064,*inout_n_density);
      return -1;
    }
    accum_3d(_n_stream,mixw_acc,n_density,local_1060,local_1064);
    ckd_free_3d(mixw_acc);
  }
  return 0;
}

Assistant:

int
rdacc_mixw(const char *dir,
           float32 **** inout_mixw_acc,
           uint32 * inout_n_mixw,
           uint32 * inout_n_stream, uint32 * inout_n_density)
{
    char fn[MAXPATHLEN + 1];
    float32 ***in_mixw_acc;
    float32 ***mixw_acc;
    uint32 n_mixw;
    uint32 n_stream;
    uint32 n_density;

    sprintf(fn, "%s/mixw_counts", dir);

    if (s3mixw_read(fn,
                    &in_mixw_acc,
                    &n_mixw, &n_stream, &n_density) != S3_SUCCESS) {
        return S3_ERROR;
    }

    mixw_acc = *inout_mixw_acc;

    if (mixw_acc == NULL) {
        *inout_mixw_acc = mixw_acc = in_mixw_acc;
        *inout_n_mixw = n_mixw;
        *inout_n_stream = n_stream;
        *inout_n_density = n_density;
    }
    else {
        if (*inout_n_mixw != n_mixw) {
            E_ERROR
                ("# mixw in file %s (== %u) != prior # mixw (== %u)\n",
                 fn, n_mixw, *inout_n_mixw);
            return S3_ERROR;
        }

        if (*inout_n_stream != n_stream) {
            E_ERROR
                ("# stream in file %s (== %u) != prior # stream (== %u)\n",
                 fn, n_stream, *inout_n_stream);
            return S3_ERROR;
        }

        if (*inout_n_density != n_density) {
            E_ERROR
                ("# density comp/mix in file %s (== %u) != prior # density (== %u)\n",
                 fn, n_density, *inout_n_density);
            return S3_ERROR;
        }

        accum_3d(mixw_acc, in_mixw_acc, n_mixw, n_stream, n_density);

        ckd_free_3d((void ***) in_mixw_acc);
    }

    return S3_SUCCESS;
}